

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
::init(GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
       *this,EVP_PKEY_CTX *ctx)

{
  DrawMethod DVar1;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
  *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  int numBytes;
  int numBytes_00;
  int numBytes_01;
  int numBytes_02;
  int numBytes_03;
  long lVar10;
  sbyte sVar11;
  char *__s;
  char *pcVar12;
  ulong uVar13;
  undefined8 uVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  bool bVar18;
  long *local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  string local_290;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
  ::init(&this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
         ,ctx);
  DVar1 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ).m_drawMethod;
  pcVar12 = "Draw method: drawElements";
  if (DVar1 == DRAWMETHOD_DRAW_ARRAYS) {
    pcVar12 = "Draw method: drawArrays";
  }
  iVar3 = *(int *)&(this->
                   super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                   ).field_0xcc;
  this_00 = (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
             *)(this->
               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
               ).m_results.
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
               ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMinWorkloadSize(this_00);
  sVar11 = (iVar3 != 1) * '\x03' + 2;
  uVar16 = iVar2 << sVar11;
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMaxWorkloadSize(this_00);
  uVar15 = iVar3 << sVar11;
  if (this->m_uploadRange != UPLOADRANGE_FULL) {
    uVar16 = ((int)uVar16 >> 1) + 3U & 0xfffffffc;
    uVar15 = ((int)uVar15 >> 1) + 3U & 0xfffffffc;
  }
  local_1b0 = (undefined1  [8])
              ((this->
               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
               ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Measuring the time used in ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar12 + 0xd,(ulong)(DVar1 != DRAWMETHOD_DRAW_ARRAYS) * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," and readPixels call with different rendering workloads.\n",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"The ",4);
  bVar18 = *(int *)&(this->
                    super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    ).field_0xcc != 1;
  pcVar12 = "vertex attrib";
  if (!bVar18) {
    pcVar12 = "index";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar12,(ulong)bVar18 * 8 + 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," buffer ",8);
  bVar18 = this->m_bufferState != BUFFERSTATE_NEW;
  pcVar17 = ::glcts::fixed_sample_locations_values + 1;
  pcVar12 = "contents ";
  if (!bVar18) {
    pcVar12 = ::glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar12,(ulong)bVar18 * 9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"sourced by the rendering command ",0x21);
  iVar4 = (int)(ostringstream *)&local_1a8;
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    pcVar12 = "is uploaded ";
LAB_01362b0b:
    sVar5 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,sVar5);
  }
  else {
    if (this->m_uploadRange == UPLOADRANGE_FULL) {
      pcVar12 = "are specified ";
      goto LAB_01362b0b;
    }
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar12 = "are updated (partial upload) ";
      goto LAB_01362b0b;
    }
    std::ios::clear(iVar4 + (int)local_1a8[-3]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"just before issuing the rendering command.\n",0x2b);
  bVar18 = this->m_bufferState != BUFFERSTATE_EXISTING;
  pcVar12 = "The buffer is generated just before uploading.\n";
  if (!bVar18) {
    pcVar12 = "The buffer has been used in rendering.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar12,(ulong)bVar18 * 8 + 0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Buffer ",7);
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    pcVar12 = "is uploaded";
LAB_01362bcc:
    sVar5 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,sVar5);
  }
  else {
    if (this->m_uploadRange == UPLOADRANGE_FULL) {
      pcVar12 = "contents are specified";
      goto LAB_01362bcc;
    }
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar12 = "contents are partially updated";
      goto LAB_01362bcc;
    }
    std::ios::clear(iVar4 + (int)local_1a8[-3]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," with ",6);
  pcVar12 = "mapBufferRange";
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
    pcVar12 = "bufferSubData";
  }
  __s = "bufferData";
  if (this->m_uploadMethod != UPLOADMETHOD_BUFFER_DATA) {
    __s = pcVar12;
  }
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," command. Usage of the target buffer is DYNAMIC_DRAW.\n",0x36);
  bVar18 = this->m_uploadMethod != UPLOADMETHOD_MAP_BUFFER_RANGE;
  pcVar12 = 
  "Mapping buffer with bits MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT | MAP_INVALIDATE_BUFFER_BIT | MAP_UNSYNCHRONIZED_BIT\n"
  ;
  if (bVar18) {
    pcVar12 = ::glcts::fixed_sample_locations_values + 1;
  }
  lVar10 = 0x77;
  if (bVar18) {
    lVar10 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,lVar10);
  bVar18 = this->m_unrelatedBufferType != UNRELATEDBUFFERTYPE_VERTEX;
  pcVar12 = 
  "Uploading an unrelated buffer just before issuing the rendering command with bufferData.\n";
  if (bVar18) {
    pcVar12 = ::glcts::fixed_sample_locations_values + 1;
  }
  lVar10 = 0x59;
  if (bVar18) {
    lVar10 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,lVar10);
  std::ostream::operator<<
            ((ostringstream *)&local_1a8,
             (int)((ulong)((long)(this->
                                 super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                                 ).m_results.
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                                ).m_results.
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," test samples. Sample order is randomized.\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
             ,0x7a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Workload sizes are in the range [",0x21);
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMinWorkloadSize
                    ((RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                      *)(this->
                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                        ).m_results.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  std::ostream::operator<<((ostringstream *)&local_1a8,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",  ",3);
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMaxWorkloadSize
                    ((RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                      *)(this->
                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                        ).m_results.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  std::ostream::operator<<((ostringstream *)&local_1a8,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] vertices ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"([",2);
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMinWorkloadSize
                    ((RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                      *)(this->
                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                        ).m_results.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)(ulong)(uint)(iVar4 << 5),numBytes);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMaxWorkloadSize
                    ((RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                      *)(this->
                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                        ).m_results.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)(ulong)(uint)(iVar4 << 5),numBytes_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"] to be processed).\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Upload sizes are in the range [",0x1f);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_230,(_anonymous_namespace_ *)(ulong)uVar16,numBytes_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)(ulong)uVar15,numBytes_02);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"].\n",3);
  DVar1 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ).m_drawMethod;
  if (DVar1 != DRAWMETHOD_DRAW_ELEMENTS) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,0x1af8059);
    goto LAB_013630e9;
  }
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1d0,(_anonymous_namespace_ *)(ulong)(uint)(iVar2 << 5),numBytes_03);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x1c2d2b9);
  local_270 = &local_260;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_260 = *plVar8;
    lStack_258 = plVar6[3];
  }
  else {
    local_260 = *plVar8;
    local_270 = (long *)*plVar6;
  }
  local_268 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_2c0 = *puVar9;
    lStack_2b8 = plVar6[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar9;
    local_2d0 = (ulong *)*plVar6;
  }
  local_2c8 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_290,(_anonymous_namespace_ *)(ulong)(uint)(iVar3 << 5),(int)local_2c8);
  uVar13 = 0xf;
  if (local_2d0 != &local_2c0) {
    uVar13 = local_2c0;
  }
  if (uVar13 < local_290._M_string_length + local_2c8) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar14 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_290._M_string_length + local_2c8) goto LAB_01363032;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
  }
  else {
LAB_01363032:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p);
  }
  local_2f0 = &local_2e0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_2e0 = *plVar6;
    uStack_2d8 = puVar7[3];
  }
  else {
    local_2e0 = *plVar6;
    local_2f0 = (long *)*puVar7;
  }
  local_2e8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  local_2b0 = &local_2a0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_2a0 = *plVar8;
    lStack_298 = plVar6[3];
  }
  else {
    local_2a0 = *plVar8;
    local_2b0 = (long *)*plVar6;
  }
  local_2a8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
LAB_013630e9:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,(char *)local_2b0,local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Test result is the approximated processing rate in MiB / s.\n",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "Note that while upload time is measured, the time used is not included in the results.\n"
             ,0x57);
  bVar18 = this->m_unrelatedBufferType != UNRELATEDBUFFERTYPE_VERTEX;
  pcVar12 = 
  "Note that the data size and the time used in the unrelated upload is not included in the results.\n"
  ;
  if (bVar18) {
    pcVar12 = ::glcts::fixed_sample_locations_values + 1;
  }
  lVar10 = 0x62;
  if (bVar18) {
    lVar10 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,lVar10);
  bVar18 = (this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
           ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS;
  if (bVar18) {
    pcVar17 = "Note that index array size is not included in the processed size.\n";
  }
  lVar10 = 0x42;
  if (!bVar18) {
    lVar10 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar17,lVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "Note! Test result may not be useful as is but instead should be compared against the reference.* group and other upload_and_draw.* group results.\n"
             ,0x92);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (DVar1 == DRAWMETHOD_DRAW_ELEMENTS) {
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0,local_2c0 + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  iVar3 = std::ios_base::~ios_base(local_138);
  return iVar3;
}

Assistant:

void GenericUploadRenderTimeCase<SampleType>::init (void)
{
	// init parent
	RenderCase<SampleType>::init();

	// log
	{
		const char* const	targetFunctionName		= (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");
		const int			perVertexSize			= (m_targetBuffer == TARGETBUFFER_INDEX) ? ((int)sizeof(deUint32)) : ((int)sizeof(tcu::Vec4[2]));
		const int			fullMinUploadSize		= RenderCase<SampleType>::getMinWorkloadSize() * perVertexSize;
		const int			fullMaxUploadSize		= RenderCase<SampleType>::getMaxWorkloadSize() * perVertexSize;
		const int			minUploadSize			= (m_uploadRange == UPLOADRANGE_FULL) ? (fullMinUploadSize) : (deAlign32(fullMinUploadSize/2, 4));
		const int			maxUploadSize			= (m_uploadRange == UPLOADRANGE_FULL) ? (fullMaxUploadSize) : (deAlign32(fullMaxUploadSize/2, 4));
		const int			minUnrelatedUploadSize	= RenderCase<SampleType>::getMinWorkloadSize() * (int)sizeof(tcu::Vec4[2]);
		const int			maxUnrelatedUploadSize	= RenderCase<SampleType>::getMaxWorkloadSize() * (int)sizeof(tcu::Vec4[2]);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Measuring the time used in " << targetFunctionName << " and readPixels call with different rendering workloads.\n"
			<< "The "
				<< ((m_targetBuffer == TARGETBUFFER_INDEX) ? ("index") : ("vertex attrib"))
				<< " buffer "
				<< ((m_bufferState == BUFFERSTATE_NEW) ? ("") : ("contents "))
				<< "sourced by the rendering command "
				<< ((m_bufferState == BUFFERSTATE_NEW)		? ("is uploaded ") :
					(m_uploadRange == UPLOADRANGE_FULL)		? ("are specified ") :
					(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("are updated (partial upload) ") :
					((const char*)DE_NULL))
				<< "just before issuing the rendering command.\n"
			<< ((m_bufferState == BUFFERSTATE_EXISTING) ? ("The buffer has been used in rendering.\n") : ("The buffer is generated just before uploading.\n"))
			<< "Buffer "
				<< ((m_bufferState == BUFFERSTATE_NEW)		? ("is uploaded") :
					(m_uploadRange == UPLOADRANGE_FULL)		? ("contents are specified") :
					(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("contents are partially updated") :
					((const char*)DE_NULL))
				<< " with "
				<< ((m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) ? ("bufferData") : (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) ? ("bufferSubData") : ("mapBufferRange"))
				<< " command. Usage of the target buffer is DYNAMIC_DRAW.\n"
			<< ((m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE) ? ("Mapping buffer with bits MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT | MAP_INVALIDATE_BUFFER_BIT | MAP_UNSYNCHRONIZED_BIT\n") : (""))
			<< ((m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) ? ("Uploading an unrelated buffer just before issuing the rendering command with bufferData.\n") : (""))
			<< RenderCase<SampleType>::getNumSamples() << " test samples. Sample order is randomized.\n"
			<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
			<< "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
			<< "Workload sizes are in the range ["
				<< RenderCase<SampleType>::getMinWorkloadSize() << ",  "
				<< RenderCase<SampleType>::getMaxWorkloadSize() << "] vertices "
				<< "(["
				<< getHumanReadableByteSize(RenderCase<SampleType>::getMinWorkloadDataSize()) << ","
				<< getHumanReadableByteSize(RenderCase<SampleType>::getMaxWorkloadDataSize()) << "] to be processed).\n"
			<< "Upload sizes are in the range ["
				<< getHumanReadableByteSize(minUploadSize) << ","
				<< getHumanReadableByteSize(maxUploadSize) << "].\n"
			<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ?
				("Unrelated upload sizes are in the range [" + getHumanReadableByteSize(minUnrelatedUploadSize) + ", " + getHumanReadableByteSize(maxUnrelatedUploadSize) + "]\n") :
				(""))
			<< "Test result is the approximated processing rate in MiB / s.\n"
			<< "Note that while upload time is measured, the time used is not included in the results.\n"
			<< ((m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) ? ("Note that the data size and the time used in the unrelated upload is not included in the results.\n") : (""))
			<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ? ("Note that index array size is not included in the processed size.\n") : (""))
			<< "Note! Test result may not be useful as is but instead should be compared against the reference.* group and other upload_and_draw.* group results.\n"
			<< tcu::TestLog::EndMessage;
	}
}